

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

bool __thiscall Am_Object::Get_Read_Only(Am_Object *this,Am_Slot_Key key)

{
  Am_Slot_Data *pAVar1;
  
  if (this->data == (Am_Object_Data *)0x0) {
    Am_Error("Get_Read_Only called on a (0L) object.");
  }
  pAVar1 = Am_Object_Data::find_slot(this->data,key);
  if (pAVar1 != (Am_Slot_Data *)0x0) {
    return (bool)((pAVar1->field_0x38 & 0x40) >> 6);
  }
  slot_error("Get_Read_Only: slot does not exist",this,key);
}

Assistant:

bool
Am_Object::Get_Read_Only(Am_Slot_Key key) const
{
  if (!data)
    Am_Error("Get_Read_Only called on a (0L) object.");
  Am_Slot_Data *slot = data->find_slot(key);
  if (!slot)
    slot_error("Get_Read_Only: slot does not exist", *this, key);
  return Am_Slot(slot).Get_Read_Only();
}